

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O2

void __thiscall
mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::WriteNL
          (NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_> *this,
          string *namebase)

{
  NLUtils *pNVar1;
  FILE *pFVar2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> fln;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,namebase,".nl");
  pNVar1 = (this->super_FormatterType).utils_;
  (*pNVar1->_vptr_NLUtils[2])
            (&local_50,pNVar1,&local_30,
             (ulong)((this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_vars < 1),"wb");
  pFVar2 = (this->nm).f_;
  (this->nm).f_ = (FILE *)local_50._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)pFVar2;
  File::~File((File *)&local_50);
  if ((this->nm).f_ == (FILE *)0x0) {
    (this->result_).first = NLW2_WriteNL_CantOpen;
    std::operator+(&local_70,&local_30,": ");
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    std::operator+(&local_50,&local_70,pcVar5);
  }
  else {
    WriteNLHeader(this);
    WriteFunctions(this);
    WriteSuffixes(this);
    WriteVarBounds(this);
    WriteInitialGuesses(this);
    WriteConBounds(this);
    WriteDualInitialGuesses(this);
    WriteDefinedVariables(this,0);
    WriteConObjExpressions(this);
    WriteColumnSizes(this);
    WriteLinearConExpr(this);
    WriteObjGradients(this);
    iVar3 = ferror((FILE *)(this->nm).f_);
    if (iVar3 == 0) {
      (this->result_).first = NLW2_WriteNL_OK;
      goto LAB_00104a22;
    }
    (this->result_).first = NLW2_WriteNL_Failed;
    std::operator+(&local_70,&local_30,": ");
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    std::operator+(&local_50,&local_70,pcVar5);
  }
  std::__cxx11::string::operator=((string *)&(this->result_).second,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
LAB_00104a22:
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void NLWriter2<Params>::WriteNL(
    const std::string& namebase) {
  auto fln = namebase + ".nl";
  nm = Utils().openf(fln,
                     Hdr().num_vars<=0,     // Delete file if true
                     "wb");
  if (nm) {
    WriteNLHeader();
    WriteFunctions();
    WriteSuffixes();
    WritePLSOSConstraints();
    if (Feeder().WantBoundsFirst()) {
      WriteVarBounds();
      WriteInitialGuesses();
      WriteConBounds();
      WriteDualInitialGuesses();
    }
    WriteDefinedVariables(0);
    WriteConObjExpressions();
    if (!Feeder().WantBoundsFirst()) {
      WriteDualInitialGuesses();
      WriteInitialGuesses();
      WriteConBounds();
      WriteVarBounds();
    }
    if (Feeder().WantColumnSizes())
      WriteColumnSizes();
    WriteLinearConExpr();
    WriteObjGradients();
    WriteRandomVariables();

    if (std::ferror(nm.GetHandle())) {
      result_.first = NLW2_WriteNL_Failed;
      result_.second = fln + ": " + std::strerror(errno);
    } else
      result_.first = NLW2_WriteNL_OK;
  } else {
    result_.first = NLW2_WriteNL_CantOpen;
    result_.second = fln + ": " + std::strerror(errno);
  }
}